

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::TraceInterpreterExecutionMode(FunctionBody *this)

{
  bool bVar1;
  ExecutionMode EVar2;
  uint sourceContextId;
  LocalFunctionId functionId;
  FunctionBody *this_local;
  
  FunctionExecutionStateMachine::AssertIsInitialized(&this->executionState);
  sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)this);
  functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec1678,ExecutionModePhase,sourceContextId,functionId);
  if ((bVar1) && (EVar2 = GetExecutionMode(this), EVar2 < SimpleJit)) {
    DoTraceExecutionMode(this,(char *)0x0);
  }
  return;
}

Assistant:

void FunctionBody::TraceInterpreterExecutionMode() const
    {
        executionState.AssertIsInitialized();

        if(!PHASE_TRACE(Phase::ExecutionModePhase, this))
        {
            return;
        }

        switch(GetExecutionMode())
        {
            case ExecutionMode::Interpreter:
            case ExecutionMode::AutoProfilingInterpreter:
            case ExecutionMode::ProfilingInterpreter:
                DoTraceExecutionMode(nullptr);
                break;
        }
    }